

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Gluco::Clause::Clause<Gluco::Clause>(Clause *this,Clause *ps,bool use_extra,bool learnt)

{
  ulong uVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  undefined7 in_register_00000011;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000009,learnt) * 4);
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000011,use_extra) << 3);
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffffffffffe0 | uVar5 | uVar3;
  uVar1 = *(ulong *)&ps->header;
  *(ulong *)&this->header = uVar1 & 0xffffffff00000000 | uVar5 | uVar3 | 0x80000000;
  if (0 < *(int *)&(ps->header).field_0x4) {
    lVar4 = 0;
    do {
      *(undefined4 *)(&this[1].header.field_0x0 + lVar4 * 4) =
           *(undefined4 *)(&ps[1].header.field_0x0 + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)&(ps->header).field_0x4);
  }
  if (use_extra) {
    if (!learnt) {
      uVar1 = *(ulong *)&this->header;
      if ((uVar1 & 8) == 0) {
        __assert_fail("header.has_extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SolverTypes.h"
                      ,0xaa,"void Gluco::Clause::calcAbstraction()");
      }
      if ((int)(uVar1 >> 0x20) < 1) {
        uVar2 = 0;
      }
      else {
        uVar3 = 0;
        uVar2 = 0;
        do {
          uVar2 = uVar2 | 1 << ((byte)(&this[1].header.field_0x0)[uVar3 * 4] >> 1 & 0x1f);
          uVar3 = uVar3 + 1;
        } while (uVar1 >> 0x20 != uVar3);
      }
      *(uint *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = uVar2;
      return;
    }
    *(undefined4 *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = 0;
  }
  return;
}

Assistant:

Clause(const V& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();
    header.lbd = 0;
    header.canbedel = 1;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
    
        if (header.has_extra){
      if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction(); }
    }